

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::Edits::Iterator::toString(Iterator *this,UnicodeString *sb)

{
  UnicodeString::doAppend(sb,L"{ src[",0,-1);
  ICU_Utility::appendNumber(sb,this->srcIndex,10,1);
  UnicodeString::doAppend(sb,L"..",0,-1);
  ICU_Utility::appendNumber(sb,this->oldLength_ + this->srcIndex,10,1);
  if (this->changed == '\0') {
    UnicodeString::doAppend(sb,L"] ≡ dest[",0,-1);
  }
  else {
    UnicodeString::doAppend(sb,L"] ⇝ dest[",0,-1);
  }
  ICU_Utility::appendNumber(sb,this->destIndex,10,1);
  UnicodeString::doAppend(sb,L"..",0,-1);
  ICU_Utility::appendNumber(sb,this->newLength_ + this->destIndex,10,1);
  if (this->changed == '\0') {
    UnicodeString::doAppend(sb,L"] (no-change) }",0,-1);
  }
  else {
    UnicodeString::doAppend(sb,L"], repl[",0,-1);
    ICU_Utility::appendNumber(sb,this->replIndex,10,1);
    UnicodeString::doAppend(sb,L"..",0,-1);
    ICU_Utility::appendNumber(sb,this->newLength_ + this->replIndex,10,1);
    UnicodeString::doAppend(sb,L"] }",0,-1);
  }
  return sb;
}

Assistant:

UnicodeString& Edits::Iterator::toString(UnicodeString& sb) const {
    sb.append(u"{ src[", -1);
    ICU_Utility::appendNumber(sb, srcIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, srcIndex + oldLength_);
    if (changed) {
        sb.append(u"] ⇝ dest[", -1);
    } else {
        sb.append(u"] ≡ dest[", -1);
    }
    ICU_Utility::appendNumber(sb, destIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, destIndex + newLength_);
    if (changed) {
        sb.append(u"], repl[", -1);
        ICU_Utility::appendNumber(sb, replIndex);
        sb.append(u"..", -1);
        ICU_Utility::appendNumber(sb, replIndex + newLength_);
        sb.append(u"] }", -1);
    } else {
        sb.append(u"] (no-change) }", -1);
    }
    return sb;
}